

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_warp_magnifier.cpp
# Opt level: O1

void __thiscall
agg::trans_warp_magnifier::inverse_transform(trans_warp_magnifier *this,double *x,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = *x - *(double *)this;
  dVar3 = *y - *(double *)(this + 8);
  dVar1 = dVar4 * dVar4 + dVar3 * dVar3;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = *(double *)(this + 0x10);
  if (*(double *)(this + 0x18) * dVar2 <= dVar1) {
    dVar2 = dVar1 - *(double *)(this + 0x18) * (dVar2 + -1.0);
    *x = (dVar4 * dVar2) / dVar1 + *(double *)this;
    dVar3 = (dVar3 * dVar2) / dVar1;
  }
  else {
    *x = dVar4 / dVar2 + *(double *)this;
    dVar3 = dVar3 / *(double *)(this + 0x10);
  }
  *y = dVar3 + *(double *)(this + 8);
  return;
}

Assistant:

void trans_warp_magnifier::inverse_transform(double* x, double* y) const
    {
        // New version by Andrew Skalkin
        //-----------------
        double dx = *x - m_xc;
        double dy = *y - m_yc;
        double r = sqrt(dx * dx + dy * dy);

        if(r < m_radius * m_magn) 
        {
            *x = m_xc + dx / m_magn;
            *y = m_yc + dy / m_magn;
        }
        else
        {
            double rnew = r - m_radius * (m_magn - 1.0);
            *x = m_xc + rnew * dx / r; 
            *y = m_yc + rnew * dy / r;
        }

        // Old version
        //-----------------
        //trans_warp_magnifier t(*this);
        //t.magnification(1.0 / m_magn);
        //t.radius(m_radius * m_magn);
        //t.transform(x, y);
    }